

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svo_bitset.cc
# Opt level: O2

void __thiscall gss::innards::SVOBitset::SVOBitset(SVOBitset *this,uint size,uint bits)

{
  BitWord *pBVar1;
  uint i;
  long lVar2;
  ulong uVar3;
  
  this->n_words = size + 0x3f >> 6;
  if (size + 0x3f < 0x440) {
    for (lVar2 = 0; lVar2 != 0x10; lVar2 = lVar2 + 1) {
      *(ulong *)((long)&this->_data + lVar2 * 8) = (ulong)bits;
    }
  }
  else {
    pBVar1 = (BitWord *)operator_new__((ulong)size * 8);
    (this->_data).long_data = pBVar1;
    for (uVar3 = 0; size != uVar3; uVar3 = uVar3 + 1) {
      (this->_data).long_data[uVar3] = (ulong)bits;
    }
  }
  return;
}

Assistant:

SVOBitset::SVOBitset(unsigned size, unsigned bits)
{
    n_words = (size + bits_per_word - 1) / (bits_per_word);
    if (n_words <= svo_size) {
        for (unsigned i = 0; i < svo_size; ++i)
            _data.short_data[i] = bits;
    }
    else {
        _data.long_data = new BitWord[size];
        for (unsigned i = 0; i < size; ++i)
            _data.long_data[i] = bits;
    }
}